

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O3

invalid_iterator * __thiscall
nlohmann::detail::invalid_iterator::
create<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (invalid_iterator *__return_storage_ptr__,invalid_iterator *this,int id_,string *what_arg,
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *context)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  long *plVar3;
  long *plVar4;
  undefined4 in_register_00000014;
  string w;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"invalid_iterator","");
  exception::name(&local_90,&local_70,(int)this);
  local_48 = 0;
  local_40 = 0;
  uVar1 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    uVar1 = local_90.field_2._M_allocated_capacity;
  }
  local_50 = &local_40;
  if ((local_90._M_string_length < 0x10) && ((ulong)uVar1 < local_90._M_string_length)) {
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_50,0,(char *)0x0,(ulong)local_90._M_dataplus._M_p);
  }
  else {
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)&local_40);
  }
  local_d0 = &local_c0;
  plVar3 = puVar2 + 2;
  if ((long *)*puVar2 == plVar3) {
    local_c0 = *plVar3;
    uStack_b8 = puVar2[3];
  }
  else {
    local_c0 = *plVar3;
    local_d0 = (long *)*puVar2;
  }
  local_c8 = puVar2[1];
  *puVar2 = plVar3;
  puVar2[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d0,*(ulong *)CONCAT44(in_register_00000014,id_));
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
    local_b0 = (long *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  exception::exception(&__return_storage_ptr__->super_exception,(int)this,(char *)local_b0);
  *(undefined ***)&__return_storage_ptr__->super_exception = &PTR__exception_0016e3e8;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static invalid_iterator create(int id_, const std::string& what_arg, const BasicJsonType& context)
    {
        std::string w = exception::name("invalid_iterator", id_) + exception::diagnostics(context) + what_arg;
        return {id_, w.c_str()};
    }